

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O0

int flatcc_verify_vector_field
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
              size_t elem_size,uint16_t align,size_t max_count)

{
  flatbuffers_uoffset_t end;
  void *buf;
  flatbuffers_uoffset_t offset;
  flatbuffers_uoffset_t local_3c;
  int ret;
  flatbuffers_uoffset_t base;
  size_t max_count_local;
  size_t sStack_28;
  uint16_t align_local;
  size_t elem_size_local;
  int required_local;
  flatbuffers_voffset_t id_local;
  flatcc_table_verifier_descriptor_t *td_local;
  
  _ret = max_count;
  max_count_local._6_2_ = align;
  sStack_28 = elem_size;
  elem_size_local._0_4_ = required;
  elem_size_local._6_2_ = id;
  _required_local = td;
  td_local._4_4_ = get_offset_field(td,id,required,&local_3c);
  if ((td_local._4_4_ == 0) && (local_3c != 0)) {
    buf = _required_local->buf;
    end = _required_local->end;
    offset = read_uoffset(_required_local->buf,local_3c);
    td_local._4_4_ =
         verify_vector(buf,end,local_3c,offset,(flatbuffers_uoffset_t)sStack_28,
                       max_count_local._6_2_,(flatbuffers_uoffset_t)_ret);
  }
  return td_local._4_4_;
}

Assistant:

int flatcc_verify_vector_field(flatcc_table_verifier_descriptor_t *td,
        voffset_t id, int required, size_t elem_size, uint16_t align, size_t max_count)
{
    uoffset_t base;

    check_field(td, id, required, base);
    return verify_vector(td->buf, td->end, base, read_uoffset(td->buf, base),
        (uoffset_t)elem_size, align, (uoffset_t)max_count);
}